

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O2

Expression *
slang::ast::CallExpression::fromSyntaxImpl
          (Compilation *compilation,ExpressionSyntax *left,InvocationExpressionSyntax *invocation,
          ArrayOrRandomizeMethodExpressionSyntax *withClause,ASTContext *context)

{
  SyntaxKind kind;
  bool bVar1;
  Expression *pEVar2;
  SourceLocation location;
  Diagnostic *this;
  Token *this_00;
  SourceRange range;
  Token local_38;
  
  this_00 = &local_38;
  kind = (left->super_SyntaxNode).kind;
  if (kind == MemberAccessExpression) {
    pEVar2 = MemberAccessExpression::fromSyntax
                       (compilation,(MemberAccessExpressionSyntax *)left,invocation,withClause,
                        context);
    return pEVar2;
  }
  bVar1 = slang::syntax::NameSyntax::isKind(kind);
  if (bVar1) {
    pEVar2 = Expression::bindName(compilation,(NameSyntax *)left,invocation,withClause,context);
    return pEVar2;
  }
  if ((invocation == (InvocationExpressionSyntax *)0x0) ||
     (invocation->arguments == (ArgumentListSyntax *)0x0)) {
    local_38 = slang::syntax::SyntaxNode::getFirstToken(&left->super_SyntaxNode);
  }
  else {
    this_00 = &invocation->arguments->openParen;
  }
  location = parsing::Token::location(this_00);
  this = ASTContext::addDiag(context,(DiagCode)0x570007,location);
  range = slang::syntax::SyntaxNode::sourceRange(&left->super_SyntaxNode);
  Diagnostic::operator<<(this,range);
  pEVar2 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar2;
}

Assistant:

Expression& CallExpression::fromSyntaxImpl(Compilation& compilation, const ExpressionSyntax& left,
                                           const InvocationExpressionSyntax* invocation,
                                           const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                           const ASTContext& context) {
    if (left.kind == SyntaxKind::MemberAccessExpression) {
        return MemberAccessExpression::fromSyntax(compilation,
                                                  left.as<MemberAccessExpressionSyntax>(),
                                                  invocation, withClause, context);
    }

    if (!NameSyntax::isKind(left.kind)) {
        SourceLocation loc = (invocation && invocation->arguments)
                                 ? invocation->arguments->openParen.location()
                                 : left.getFirstToken().location();
        auto& diag = context.addDiag(diag::ExpressionNotCallable, loc);
        diag << left.sourceRange();
        return badExpr(compilation, nullptr);
    }

    return bindName(compilation, left.as<NameSyntax>(), invocation, withClause, context);
}